

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

string * __thiscall pbrt::SquareMatrix<3>::ToString_abi_cxx11_(SquareMatrix<3> *this)

{
  string *in_RDI;
  int j;
  int i;
  string *s;
  float *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  int local_28;
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
             ,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(&local_12);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      StringPrintf<float_const&>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      if (iVar1 < 2) {
        std::__cxx11::string::operator+=((string *)in_RDI,',');
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI," ]");
      }
    }
    if (local_28 < 2) {
      std::__cxx11::string::operator+=((string *)in_RDI,", [");
    }
  }
  std::__cxx11::string::operator+=((string *)in_RDI," ]");
  return in_RDI;
}

Assistant:

std::string SquareMatrix<N>::ToString() const {
    std::string s = "[ [";
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < N; ++j) {
            s += StringPrintf(" %f", m[i][j]);
            if (j < N - 1)
                s += ',';
            else
                s += " ]";
        }
        if (i < N - 1)
            s += ", [";
    }
    s += " ]";
    return s;
}